

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_257,_false,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  bool bVar18;
  char cVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  NodeRef *pNVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong unaff_R15;
  undefined1 auVar31 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  float fVar38;
  undefined1 auVar34 [32];
  undefined1 auVar39 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar40 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  float fVar65;
  vfloat4 a0;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [32];
  float fVar71;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  float fVar82;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar86 [64];
  float fVar93;
  float fVar98;
  float fVar99;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar100;
  undefined1 auVar96 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  Precalculations pre;
  NodeRef stack [564];
  undefined1 auVar56 [32];
  undefined1 auVar59 [32];
  undefined1 auVar64 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar35 = ray->tfar;
    if (0.0 <= fVar35) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar53 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar54 = vrsqrtss_avx(auVar53,auVar53);
      fVar65 = auVar54._0_4_;
      pre.depth_scale = fVar65 * 1.5 - auVar53._0_4_ * 0.5 * fVar65 * fVar65 * fVar65;
      fVar65 = (ray->dir).field_0.m128[0];
      auVar46 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
      auVar66._0_4_ = aVar5.x * auVar46._0_4_;
      auVar66._4_4_ = aVar5.y * auVar46._4_4_;
      auVar66._8_4_ = aVar5.z * auVar46._8_4_;
      auVar66._12_4_ = aVar5.field_3.w * auVar46._12_4_;
      auVar54 = vshufpd_avx(auVar66,auVar66,1);
      auVar53 = vmovshdup_avx(auVar66);
      auVar83._8_4_ = 0x80000000;
      auVar83._0_8_ = 0x8000000080000000;
      auVar83._12_4_ = 0x80000000;
      auVar68._12_4_ = 0;
      auVar68._0_12_ = ZEXT812(0);
      auVar68 = auVar68 << 0x20;
      auVar57 = vunpckhps_avx(auVar66,auVar68);
      auVar60 = vshufps_avx(auVar57,ZEXT416(auVar53._0_4_ ^ 0x80000000),0x41);
      auVar72._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
      auVar72._8_8_ = auVar54._8_8_ ^ auVar83._8_8_;
      auVar57 = vinsertps_avx(auVar72,auVar66,0x2a);
      auVar53 = vdpps_avx(auVar60,auVar60,0x7f);
      auVar54 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar53 = vcmpps_avx(auVar54,auVar53,1);
      auVar53 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = vblendvps_avx(auVar57,auVar60,auVar53);
      auVar54 = vdpps_avx(auVar53,auVar53,0x7f);
      fVar1 = (ray->dir).field_0.m128[1];
      auVar57 = vrsqrtss_avx(auVar54,auVar54);
      fVar69 = auVar57._0_4_;
      fVar2 = (ray->dir).field_0.m128[2];
      auVar54 = ZEXT416((uint)(fVar69 * 1.5 - auVar54._0_4_ * 0.5 * fVar69 * fVar69 * fVar69));
      auVar54 = vshufps_avx(auVar54,auVar54,0);
      auVar73._0_4_ = auVar53._0_4_ * auVar54._0_4_;
      auVar73._4_4_ = auVar53._4_4_ * auVar54._4_4_;
      auVar73._8_4_ = auVar53._8_4_ * auVar54._8_4_;
      auVar73._12_4_ = auVar53._12_4_ * auVar54._12_4_;
      auVar53 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar54 = vshufps_avx(auVar66,auVar66,0xc9);
      auVar94._0_4_ = auVar54._0_4_ * auVar73._0_4_;
      auVar94._4_4_ = auVar54._4_4_ * auVar73._4_4_;
      auVar94._8_4_ = auVar54._8_4_ * auVar73._8_4_;
      auVar94._12_4_ = auVar54._12_4_ * auVar73._12_4_;
      auVar84._0_4_ = auVar53._0_4_ * auVar66._0_4_;
      auVar84._4_4_ = auVar53._4_4_ * auVar66._4_4_;
      auVar84._8_4_ = auVar53._8_4_ * auVar66._8_4_;
      auVar84._12_4_ = auVar53._12_4_ * auVar66._12_4_;
      auVar53 = vsubps_avx(auVar84,auVar94);
      auVar57 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar86 = ZEXT1664(auVar57);
      auVar53 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar97 = ZEXT1664(auVar53);
      auVar54 = vrsqrtss_avx(auVar53,auVar53);
      fVar69 = auVar54._0_4_;
      auVar53 = ZEXT416((uint)(fVar69 * 1.5 - fVar69 * fVar69 * fVar69 * auVar53._0_4_ * 0.5));
      auVar53 = vshufps_avx(auVar53,auVar53,0);
      auVar54._0_4_ = auVar57._0_4_ * auVar53._0_4_;
      auVar54._4_4_ = auVar57._4_4_ * auVar53._4_4_;
      auVar54._8_4_ = auVar57._8_4_ * auVar53._8_4_;
      auVar54._12_4_ = auVar57._12_4_ * auVar53._12_4_;
      auVar53._0_4_ = auVar46._0_4_ * auVar66._0_4_;
      auVar53._4_4_ = auVar46._4_4_ * auVar66._4_4_;
      auVar53._8_4_ = auVar46._8_4_ * auVar66._8_4_;
      auVar53._12_4_ = auVar46._12_4_ * auVar66._12_4_;
      auVar57 = vunpcklps_avx(auVar73,auVar53);
      auVar53 = vunpckhps_avx(auVar73,auVar53);
      auVar46 = vunpcklps_avx(auVar54,auVar68);
      auVar54 = vunpckhps_avx(auVar54,auVar68);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar54);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar57,auVar46);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar57,auVar46);
      pNVar26 = stack + 1;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx((undefined1  [16])aVar5,auVar57);
      auVar60._8_4_ = 0x219392ef;
      auVar60._0_8_ = 0x219392ef219392ef;
      auVar60._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar60,1);
      auVar53 = vblendvps_avx((undefined1  [16])aVar5,auVar60,auVar53);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar57 = vrcpps_avx(auVar53);
      fVar36 = auVar57._0_4_;
      auVar46._0_4_ = auVar53._0_4_ * fVar36;
      fVar37 = auVar57._4_4_;
      auVar46._4_4_ = auVar53._4_4_ * fVar37;
      fVar38 = auVar57._8_4_;
      auVar46._8_4_ = auVar53._8_4_ * fVar38;
      fVar41 = auVar57._12_4_;
      auVar46._12_4_ = auVar53._12_4_ * fVar41;
      auVar61._8_4_ = 0x3f800000;
      auVar61._0_8_ = &DAT_3f8000003f800000;
      auVar61._12_4_ = 0x3f800000;
      auVar53 = vsubps_avx(auVar61,auVar46);
      fVar69 = (ray->org).field_0.m128[0];
      auVar107._4_4_ = fVar69;
      auVar107._0_4_ = fVar69;
      auVar107._8_4_ = fVar69;
      auVar107._12_4_ = fVar69;
      auVar107._16_4_ = fVar69;
      auVar107._20_4_ = fVar69;
      auVar107._24_4_ = fVar69;
      auVar107._28_4_ = fVar69;
      fVar3 = (ray->org).field_0.m128[1];
      auVar67._4_4_ = fVar3;
      auVar67._0_4_ = fVar3;
      auVar67._8_4_ = fVar3;
      auVar67._12_4_ = fVar3;
      auVar67._16_4_ = fVar3;
      auVar67._20_4_ = fVar3;
      auVar67._24_4_ = fVar3;
      auVar67._28_4_ = fVar3;
      fVar4 = (ray->org).field_0.m128[2];
      auVar105._4_4_ = fVar4;
      auVar105._0_4_ = fVar4;
      auVar105._8_4_ = fVar4;
      auVar105._12_4_ = fVar4;
      auVar105._16_4_ = fVar4;
      auVar105._20_4_ = fVar4;
      auVar105._24_4_ = fVar4;
      auVar105._28_4_ = fVar4;
      auVar42._0_4_ = fVar36 + fVar36 * auVar53._0_4_;
      auVar42._4_4_ = fVar37 + fVar37 * auVar53._4_4_;
      auVar42._8_4_ = fVar38 + fVar38 * auVar53._8_4_;
      auVar42._12_4_ = fVar41 + fVar41 * auVar53._12_4_;
      auVar46 = vshufps_avx(auVar42,auVar42,0);
      auVar53 = vmovshdup_avx(auVar42);
      auVar60 = vshufps_avx(auVar42,auVar42,0x55);
      auVar57 = vshufpd_avx(auVar42,auVar42,1);
      auVar68 = vshufps_avx(auVar42,auVar42,0xaa);
      uVar27 = (ulong)(auVar42._0_4_ < 0.0) * 0x20;
      uVar29 = (ulong)(auVar53._0_4_ < 0.0) << 5 | 0x40;
      uVar28 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x80;
      auVar53 = vshufps_avx(auVar54,auVar54,0);
      auVar63._16_16_ = auVar53;
      auVar63._0_16_ = auVar53;
      auVar53 = vshufps_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35),0);
      auVar74._16_16_ = auVar53;
      auVar74._0_16_ = auVar53;
      do {
        if (pNVar26 == stack) {
          return;
        }
        uVar22 = pNVar26[-1].ptr;
        pNVar26 = pNVar26 + -1;
        do {
          fVar35 = auVar46._12_4_;
          fVar36 = auVar60._12_4_;
          if ((uVar22 & 0xf) == 0) {
            auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar27),auVar107);
            fVar43 = auVar46._0_4_;
            fVar44 = auVar46._4_4_;
            auVar8._4_4_ = fVar44 * auVar96._4_4_;
            auVar8._0_4_ = fVar43 * auVar96._0_4_;
            fVar45 = auVar46._8_4_;
            auVar8._8_4_ = fVar45 * auVar96._8_4_;
            auVar8._12_4_ = fVar35 * auVar96._12_4_;
            auVar8._16_4_ = fVar43 * auVar96._16_4_;
            auVar8._20_4_ = fVar44 * auVar96._20_4_;
            auVar8._24_4_ = fVar45 * auVar96._24_4_;
            auVar8._28_4_ = auVar96._28_4_;
            auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar29),auVar67);
            fVar49 = auVar60._0_4_;
            fVar50 = auVar60._4_4_;
            auVar9._4_4_ = fVar50 * auVar96._4_4_;
            auVar9._0_4_ = fVar49 * auVar96._0_4_;
            fVar51 = auVar60._8_4_;
            auVar9._8_4_ = fVar51 * auVar96._8_4_;
            auVar9._12_4_ = fVar36 * auVar96._12_4_;
            auVar9._16_4_ = fVar49 * auVar96._16_4_;
            auVar9._20_4_ = fVar50 * auVar96._20_4_;
            auVar9._24_4_ = fVar51 * auVar96._24_4_;
            auVar9._28_4_ = auVar96._28_4_;
            auVar96 = vmaxps_avx(auVar8,auVar9);
            auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar28),auVar105);
            fVar37 = auVar68._0_4_;
            fVar38 = auVar68._4_4_;
            auVar10._4_4_ = fVar38 * auVar34._4_4_;
            auVar10._0_4_ = fVar37 * auVar34._0_4_;
            fVar41 = auVar68._8_4_;
            auVar10._8_4_ = fVar41 * auVar34._8_4_;
            auVar10._12_4_ = auVar68._12_4_ * auVar34._12_4_;
            auVar10._16_4_ = fVar37 * auVar34._16_4_;
            auVar10._20_4_ = fVar38 * auVar34._20_4_;
            auVar10._24_4_ = fVar41 * auVar34._24_4_;
            auVar10._28_4_ = auVar34._28_4_;
            auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar27 ^ 0x20)),auVar107);
            auVar11._4_4_ = fVar44 * auVar34._4_4_;
            auVar11._0_4_ = fVar43 * auVar34._0_4_;
            auVar11._8_4_ = fVar45 * auVar34._8_4_;
            auVar11._12_4_ = fVar35 * auVar34._12_4_;
            auVar11._16_4_ = fVar43 * auVar34._16_4_;
            auVar11._20_4_ = fVar44 * auVar34._20_4_;
            auVar11._24_4_ = fVar45 * auVar34._24_4_;
            auVar11._28_4_ = auVar34._28_4_;
            auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar29 ^ 0x20)),auVar67);
            auVar12._4_4_ = fVar50 * auVar34._4_4_;
            auVar12._0_4_ = fVar49 * auVar34._0_4_;
            auVar12._8_4_ = fVar51 * auVar34._8_4_;
            auVar12._12_4_ = fVar36 * auVar34._12_4_;
            auVar12._16_4_ = fVar49 * auVar34._16_4_;
            auVar12._20_4_ = fVar50 * auVar34._20_4_;
            auVar12._24_4_ = fVar51 * auVar34._24_4_;
            auVar12._28_4_ = auVar34._28_4_;
            auVar40 = vminps_avx(auVar11,auVar12);
            auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar28 ^ 0x20)),auVar105);
            auVar13._4_4_ = fVar38 * auVar34._4_4_;
            auVar13._0_4_ = fVar37 * auVar34._0_4_;
            auVar13._8_4_ = fVar41 * auVar34._8_4_;
            auVar13._12_4_ = auVar68._12_4_ * auVar34._12_4_;
            auVar13._16_4_ = fVar37 * auVar34._16_4_;
            auVar13._20_4_ = fVar38 * auVar34._20_4_;
            auVar13._24_4_ = fVar41 * auVar34._24_4_;
            auVar13._28_4_ = auVar34._28_4_;
            auVar34 = vmaxps_avx(auVar10,auVar63);
            auVar96 = vmaxps_avx(auVar96,auVar34);
            auVar34 = vminps_avx(auVar13,auVar74);
            auVar34 = vminps_avx(auVar40,auVar34);
            auVar96 = vcmpps_avx(auVar96,auVar34,2);
LAB_00301d0b:
            uVar30 = vmovmskps_avx(auVar96);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar30);
            bVar18 = true;
          }
          else {
            if ((int)(uVar22 & 0xf) == 2) {
              uVar21 = uVar22 & 0xfffffffffffffff0;
              fVar37 = *(float *)(uVar21 + 0xbc);
              auVar85._0_4_ =
                   fVar1 * *(float *)(uVar21 + 0xa0) + fVar2 * *(float *)(uVar21 + 0x100) +
                   fVar65 * *(float *)(uVar21 + 0x40);
              auVar85._4_4_ =
                   fVar1 * *(float *)(uVar21 + 0xa4) + fVar2 * *(float *)(uVar21 + 0x104) +
                   fVar65 * *(float *)(uVar21 + 0x44);
              auVar85._8_4_ =
                   fVar1 * *(float *)(uVar21 + 0xa8) + fVar2 * *(float *)(uVar21 + 0x108) +
                   fVar65 * *(float *)(uVar21 + 0x48);
              auVar85._12_4_ =
                   fVar1 * *(float *)(uVar21 + 0xac) + fVar2 * *(float *)(uVar21 + 0x10c) +
                   fVar65 * *(float *)(uVar21 + 0x4c);
              auVar85._16_4_ =
                   fVar1 * *(float *)(uVar21 + 0xb0) + fVar2 * *(float *)(uVar21 + 0x110) +
                   fVar65 * *(float *)(uVar21 + 0x50);
              auVar85._20_4_ =
                   fVar1 * *(float *)(uVar21 + 0xb4) + fVar2 * *(float *)(uVar21 + 0x114) +
                   fVar65 * *(float *)(uVar21 + 0x54);
              auVar85._24_4_ =
                   fVar1 * *(float *)(uVar21 + 0xb8) + fVar2 * *(float *)(uVar21 + 0x118) +
                   fVar65 * *(float *)(uVar21 + 0x58);
              auVar85._28_4_ = auVar86._28_4_ + fVar35 + fVar1;
              auVar95._0_4_ =
                   fVar2 * *(float *)(uVar21 + 0x120) + fVar1 * *(float *)(uVar21 + 0xc0) +
                   fVar65 * *(float *)(uVar21 + 0x60);
              auVar95._4_4_ =
                   fVar2 * *(float *)(uVar21 + 0x124) + fVar1 * *(float *)(uVar21 + 0xc4) +
                   fVar65 * *(float *)(uVar21 + 100);
              auVar95._8_4_ =
                   fVar2 * *(float *)(uVar21 + 0x128) + fVar1 * *(float *)(uVar21 + 200) +
                   fVar65 * *(float *)(uVar21 + 0x68);
              auVar95._12_4_ =
                   fVar2 * *(float *)(uVar21 + 300) + fVar1 * *(float *)(uVar21 + 0xcc) +
                   fVar65 * *(float *)(uVar21 + 0x6c);
              auVar95._16_4_ =
                   fVar2 * *(float *)(uVar21 + 0x130) + fVar1 * *(float *)(uVar21 + 0xd0) +
                   fVar65 * *(float *)(uVar21 + 0x70);
              auVar95._20_4_ =
                   fVar2 * *(float *)(uVar21 + 0x134) + fVar1 * *(float *)(uVar21 + 0xd4) +
                   fVar65 * *(float *)(uVar21 + 0x74);
              auVar95._24_4_ =
                   fVar2 * *(float *)(uVar21 + 0x138) + fVar1 * *(float *)(uVar21 + 0xd8) +
                   fVar65 * *(float *)(uVar21 + 0x78);
              auVar95._28_4_ = fVar36 + auVar97._28_4_ + fVar1;
              auVar75._0_4_ =
                   fVar2 * *(float *)(uVar21 + 0x140) + fVar1 * *(float *)(uVar21 + 0xe0) +
                   fVar65 * *(float *)(uVar21 + 0x80);
              auVar75._4_4_ =
                   fVar2 * *(float *)(uVar21 + 0x144) + fVar1 * *(float *)(uVar21 + 0xe4) +
                   fVar65 * *(float *)(uVar21 + 0x84);
              auVar75._8_4_ =
                   fVar2 * *(float *)(uVar21 + 0x148) + fVar1 * *(float *)(uVar21 + 0xe8) +
                   fVar65 * *(float *)(uVar21 + 0x88);
              auVar75._12_4_ =
                   fVar2 * *(float *)(uVar21 + 0x14c) + fVar1 * *(float *)(uVar21 + 0xec) +
                   fVar65 * *(float *)(uVar21 + 0x8c);
              auVar75._16_4_ =
                   fVar2 * *(float *)(uVar21 + 0x150) + fVar1 * *(float *)(uVar21 + 0xf0) +
                   fVar65 * *(float *)(uVar21 + 0x90);
              auVar75._20_4_ =
                   fVar2 * *(float *)(uVar21 + 0x154) + fVar1 * *(float *)(uVar21 + 0xf4) +
                   fVar65 * *(float *)(uVar21 + 0x94);
              auVar75._24_4_ =
                   fVar2 * *(float *)(uVar21 + 0x158) + fVar1 * *(float *)(uVar21 + 0xf8) +
                   fVar65 * *(float *)(uVar21 + 0x98);
              auVar75._28_4_ = auVar53._12_4_ + fVar1 + fVar1;
              auVar104._8_4_ = 0x7fffffff;
              auVar104._0_8_ = 0x7fffffff7fffffff;
              auVar104._12_4_ = 0x7fffffff;
              auVar104._16_4_ = 0x7fffffff;
              auVar104._20_4_ = 0x7fffffff;
              auVar104._24_4_ = 0x7fffffff;
              auVar104._28_4_ = 0x7fffffff;
              auVar96 = vandps_avx(auVar85,auVar104);
              auVar32._8_4_ = 0x219392ef;
              auVar32._0_8_ = 0x219392ef219392ef;
              auVar32._12_4_ = 0x219392ef;
              auVar32._16_4_ = 0x219392ef;
              auVar32._20_4_ = 0x219392ef;
              auVar32._24_4_ = 0x219392ef;
              auVar32._28_4_ = 0x219392ef;
              auVar96 = vcmpps_avx(auVar96,auVar32,1);
              auVar34 = vblendvps_avx(auVar85,auVar32,auVar96);
              auVar96 = vandps_avx(auVar95,auVar104);
              auVar96 = vcmpps_avx(auVar96,auVar32,1);
              auVar40 = vblendvps_avx(auVar95,auVar32,auVar96);
              auVar96 = vandps_avx(auVar75,auVar104);
              auVar96 = vcmpps_avx(auVar96,auVar32,1);
              auVar96 = vblendvps_avx(auVar75,auVar32,auVar96);
              auVar32 = vrcpps_avx(auVar34);
              fVar71 = auVar32._0_4_;
              fVar76 = auVar32._4_4_;
              auVar6._4_4_ = fVar76 * auVar34._4_4_;
              auVar6._0_4_ = fVar71 * auVar34._0_4_;
              fVar77 = auVar32._8_4_;
              auVar6._8_4_ = fVar77 * auVar34._8_4_;
              fVar78 = auVar32._12_4_;
              auVar6._12_4_ = fVar78 * auVar34._12_4_;
              fVar79 = auVar32._16_4_;
              auVar6._16_4_ = fVar79 * auVar34._16_4_;
              fVar80 = auVar32._20_4_;
              auVar6._20_4_ = fVar80 * auVar34._20_4_;
              fVar81 = auVar32._24_4_;
              auVar6._24_4_ = fVar81 * auVar34._24_4_;
              auVar6._28_4_ = auVar34._28_4_;
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar6 = vsubps_avx(auVar33,auVar6);
              auVar34 = vrcpps_avx(auVar40);
              fVar71 = fVar71 + fVar71 * auVar6._0_4_;
              fVar76 = fVar76 + fVar76 * auVar6._4_4_;
              fVar77 = fVar77 + fVar77 * auVar6._8_4_;
              fVar78 = fVar78 + fVar78 * auVar6._12_4_;
              fVar79 = fVar79 + fVar79 * auVar6._16_4_;
              fVar80 = fVar80 + fVar80 * auVar6._20_4_;
              fVar81 = fVar81 + fVar81 * auVar6._24_4_;
              fVar82 = auVar34._0_4_;
              fVar87 = auVar34._4_4_;
              auVar7._4_4_ = fVar87 * auVar40._4_4_;
              auVar7._0_4_ = fVar82 * auVar40._0_4_;
              fVar88 = auVar34._8_4_;
              auVar7._8_4_ = fVar88 * auVar40._8_4_;
              fVar89 = auVar34._12_4_;
              auVar7._12_4_ = fVar89 * auVar40._12_4_;
              fVar90 = auVar34._16_4_;
              auVar7._16_4_ = fVar90 * auVar40._16_4_;
              fVar91 = auVar34._20_4_;
              auVar7._20_4_ = fVar91 * auVar40._20_4_;
              fVar92 = auVar34._24_4_;
              auVar7._24_4_ = fVar92 * auVar40._24_4_;
              auVar7._28_4_ = auVar6._28_4_;
              auVar7 = vsubps_avx(auVar33,auVar7);
              auVar40 = vrcpps_avx(auVar96);
              fVar82 = fVar82 + fVar82 * auVar7._0_4_;
              fVar87 = fVar87 + fVar87 * auVar7._4_4_;
              fVar88 = fVar88 + fVar88 * auVar7._8_4_;
              fVar89 = fVar89 + fVar89 * auVar7._12_4_;
              fVar90 = fVar90 + fVar90 * auVar7._16_4_;
              fVar91 = fVar91 + fVar91 * auVar7._20_4_;
              fVar92 = fVar92 + fVar92 * auVar7._24_4_;
              fVar93 = auVar40._0_4_;
              fVar98 = auVar40._4_4_;
              auVar14._4_4_ = fVar98 * auVar96._4_4_;
              auVar14._0_4_ = fVar93 * auVar96._0_4_;
              fVar99 = auVar40._8_4_;
              auVar14._8_4_ = fVar99 * auVar96._8_4_;
              fVar100 = auVar40._12_4_;
              auVar14._12_4_ = fVar100 * auVar96._12_4_;
              fVar101 = auVar40._16_4_;
              auVar14._16_4_ = fVar101 * auVar96._16_4_;
              fVar102 = auVar40._20_4_;
              auVar14._20_4_ = fVar102 * auVar96._20_4_;
              fVar103 = auVar40._24_4_;
              auVar14._24_4_ = fVar103 * auVar96._24_4_;
              auVar14._28_4_ = auVar96._28_4_;
              auVar96 = vsubps_avx(auVar33,auVar14);
              fVar93 = fVar93 + fVar93 * auVar96._0_4_;
              fVar98 = fVar98 + fVar98 * auVar96._4_4_;
              fVar99 = fVar99 + fVar99 * auVar96._8_4_;
              fVar100 = fVar100 + fVar100 * auVar96._12_4_;
              fVar101 = fVar101 + fVar101 * auVar96._16_4_;
              fVar102 = fVar102 + fVar102 * auVar96._20_4_;
              fVar103 = fVar103 + fVar103 * auVar96._24_4_;
              fVar52 = *(float *)(uVar21 + 0x5c) +
                       fVar37 + *(float *)(uVar21 + 0x11c) + *(float *)(uVar21 + 0x17c);
              auVar47._0_4_ =
                   -fVar71 * (fVar69 * *(float *)(uVar21 + 0x40) +
                             *(float *)(uVar21 + 0xa0) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x100) + *(float *)(uVar21 + 0x160));
              auVar47._4_4_ =
                   -fVar76 * (fVar69 * *(float *)(uVar21 + 0x44) +
                             *(float *)(uVar21 + 0xa4) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x104) + *(float *)(uVar21 + 0x164));
              auVar47._8_4_ =
                   -fVar77 * (fVar69 * *(float *)(uVar21 + 0x48) +
                             *(float *)(uVar21 + 0xa8) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x108) + *(float *)(uVar21 + 0x168));
              auVar47._12_4_ =
                   -fVar78 * (fVar69 * *(float *)(uVar21 + 0x4c) +
                             *(float *)(uVar21 + 0xac) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x10c) + *(float *)(uVar21 + 0x16c));
              fVar49 = -fVar79 * (fVar69 * *(float *)(uVar21 + 0x50) +
                                 *(float *)(uVar21 + 0xb0) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x110) + *(float *)(uVar21 + 0x170));
              auVar15._16_4_ = fVar49;
              auVar15._0_16_ = auVar47;
              fVar50 = -fVar80 * (fVar69 * *(float *)(uVar21 + 0x54) +
                                 *(float *)(uVar21 + 0xb4) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x114) + *(float *)(uVar21 + 0x174));
              auVar15._20_4_ = fVar50;
              fVar51 = -fVar81 * (fVar69 * *(float *)(uVar21 + 0x58) +
                                 *(float *)(uVar21 + 0xb8) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x118) + *(float *)(uVar21 + 0x178));
              auVar15._24_4_ = fVar51;
              auVar15._28_4_ = fVar52;
              fVar45 = *(float *)(uVar21 + 0x7c) +
                       fVar37 + *(float *)(uVar21 + 0x13c) + *(float *)(uVar21 + 0x19c);
              auVar39._0_4_ =
                   -fVar82 * (fVar69 * *(float *)(uVar21 + 0x60) +
                             *(float *)(uVar21 + 0xc0) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x120) + *(float *)(uVar21 + 0x180));
              auVar39._4_4_ =
                   -fVar87 * (fVar69 * *(float *)(uVar21 + 100) +
                             *(float *)(uVar21 + 0xc4) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x124) + *(float *)(uVar21 + 0x184));
              auVar39._8_4_ =
                   -fVar88 * (fVar69 * *(float *)(uVar21 + 0x68) +
                             *(float *)(uVar21 + 200) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x128) + *(float *)(uVar21 + 0x188));
              auVar39._12_4_ =
                   -fVar89 * (fVar69 * *(float *)(uVar21 + 0x6c) +
                             *(float *)(uVar21 + 0xcc) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 300) + *(float *)(uVar21 + 0x18c));
              fVar41 = -fVar90 * (fVar69 * *(float *)(uVar21 + 0x70) +
                                 *(float *)(uVar21 + 0xd0) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x130) + *(float *)(uVar21 + 400));
              auVar16._16_4_ = fVar41;
              auVar16._0_16_ = auVar39;
              fVar43 = -fVar91 * (fVar69 * *(float *)(uVar21 + 0x74) +
                                 *(float *)(uVar21 + 0xd4) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x134) + *(float *)(uVar21 + 0x194));
              auVar16._20_4_ = fVar43;
              fVar44 = -fVar92 * (fVar69 * *(float *)(uVar21 + 0x78) +
                                 *(float *)(uVar21 + 0xd8) * fVar3 +
                                 fVar4 * *(float *)(uVar21 + 0x138) + *(float *)(uVar21 + 0x198));
              auVar16._24_4_ = fVar44;
              auVar16._28_4_ = fVar45;
              fVar38 = fVar37 + *(float *)(uVar21 + 0x15c) + *(float *)(uVar21 + 0x1bc) + -0.0;
              auVar31._0_4_ =
                   -fVar93 * (fVar69 * *(float *)(uVar21 + 0x80) +
                             *(float *)(uVar21 + 0xe0) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x140) + *(float *)(uVar21 + 0x1a0));
              auVar31._4_4_ =
                   -fVar98 * (fVar69 * *(float *)(uVar21 + 0x84) +
                             *(float *)(uVar21 + 0xe4) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x144) + *(float *)(uVar21 + 0x1a4));
              auVar31._8_4_ =
                   -fVar99 * (fVar69 * *(float *)(uVar21 + 0x88) +
                             *(float *)(uVar21 + 0xe8) * fVar3 +
                             fVar4 * *(float *)(uVar21 + 0x148) + *(float *)(uVar21 + 0x1a8));
              auVar31._12_4_ =
                   -fVar100 *
                   (fVar69 * *(float *)(uVar21 + 0x8c) +
                   *(float *)(uVar21 + 0xec) * fVar3 +
                   fVar4 * *(float *)(uVar21 + 0x14c) + *(float *)(uVar21 + 0x1ac));
              fVar35 = -fVar101 *
                       (fVar69 * *(float *)(uVar21 + 0x90) +
                       *(float *)(uVar21 + 0xf0) * fVar3 +
                       fVar4 * *(float *)(uVar21 + 0x150) + *(float *)(uVar21 + 0x1b0));
              auVar17._16_4_ = fVar35;
              auVar17._0_16_ = auVar31;
              fVar36 = -fVar102 *
                       (fVar69 * *(float *)(uVar21 + 0x94) +
                       *(float *)(uVar21 + 0xf4) * fVar3 +
                       fVar4 * *(float *)(uVar21 + 0x154) + *(float *)(uVar21 + 0x1b4));
              auVar17._20_4_ = fVar36;
              fVar37 = -fVar103 *
                       (fVar69 * *(float *)(uVar21 + 0x98) +
                       *(float *)(uVar21 + 0xf8) * fVar3 +
                       fVar4 * *(float *)(uVar21 + 0x158) + *(float *)(uVar21 + 0x1b8));
              auVar17._24_4_ = fVar37;
              auVar17._28_4_ = fVar38;
              auVar58._0_4_ = fVar71 + auVar47._0_4_;
              auVar58._4_4_ = fVar76 + auVar47._4_4_;
              auVar58._8_4_ = fVar77 + auVar47._8_4_;
              auVar58._12_4_ = fVar78 + auVar47._12_4_;
              auVar59._16_4_ = fVar79 + fVar49;
              auVar59._0_16_ = auVar58;
              auVar59._20_4_ = fVar80 + fVar50;
              auVar59._24_4_ = fVar81 + fVar51;
              auVar59._28_4_ = auVar32._28_4_ + auVar6._28_4_ + fVar52;
              auVar62._0_4_ = fVar82 + auVar39._0_4_;
              auVar62._4_4_ = fVar87 + auVar39._4_4_;
              auVar62._8_4_ = fVar88 + auVar39._8_4_;
              auVar62._12_4_ = fVar89 + auVar39._12_4_;
              auVar64._16_4_ = fVar90 + fVar41;
              auVar64._0_16_ = auVar62;
              auVar64._20_4_ = fVar91 + fVar43;
              auVar64._24_4_ = fVar92 + fVar44;
              auVar64._28_4_ = auVar34._28_4_ + auVar7._28_4_ + fVar45;
              auVar55._0_4_ = fVar93 + auVar31._0_4_;
              auVar55._4_4_ = fVar98 + auVar31._4_4_;
              auVar55._8_4_ = fVar99 + auVar31._8_4_;
              auVar55._12_4_ = fVar100 + auVar31._12_4_;
              auVar56._16_4_ = fVar101 + fVar35;
              auVar56._0_16_ = auVar55;
              auVar56._20_4_ = fVar102 + fVar36;
              auVar56._24_4_ = fVar103 + fVar37;
              auVar56._28_4_ = auVar40._28_4_ + auVar96._28_4_ + fVar38;
              auVar54 = vpminsd_avx(auVar15._16_16_,auVar59._16_16_);
              auVar57 = vpminsd_avx(auVar47,auVar58);
              auVar70._16_16_ = auVar54;
              auVar70._0_16_ = auVar57;
              auVar42 = auVar16._16_16_;
              auVar86 = ZEXT1664(auVar42);
              auVar54 = vpminsd_avx(auVar42,auVar64._16_16_);
              auVar57 = vpminsd_avx(auVar39,auVar62);
              auVar96._16_16_ = auVar54;
              auVar96._0_16_ = auVar57;
              auVar54 = vpminsd_avx(auVar17._16_16_,auVar56._16_16_);
              auVar57 = vpminsd_avx(auVar31,auVar55);
              auVar106._16_16_ = auVar54;
              auVar106._0_16_ = auVar57;
              auVar96 = vmaxps_avx(auVar96,auVar106);
              auVar97 = ZEXT3264(auVar96);
              auVar54 = vpmaxsd_avx(auVar15._16_16_,auVar59._16_16_);
              auVar57 = vpmaxsd_avx(auVar47,auVar58);
              auVar48._16_16_ = auVar54;
              auVar48._0_16_ = auVar57;
              auVar54 = vpmaxsd_avx(auVar42,auVar64._16_16_);
              auVar57 = vpmaxsd_avx(auVar39,auVar62);
              auVar40._16_16_ = auVar54;
              auVar40._0_16_ = auVar57;
              auVar54 = vpmaxsd_avx(auVar17._16_16_,auVar56._16_16_);
              auVar57 = vpmaxsd_avx(auVar31,auVar55);
              auVar34._16_16_ = auVar54;
              auVar34._0_16_ = auVar57;
              auVar40 = vminps_avx(auVar40,auVar34);
              auVar34 = vmaxps_avx(auVar63,auVar70);
              auVar96 = vmaxps_avx(auVar34,auVar96);
              auVar34 = vminps_avx(auVar74,auVar48);
              auVar34 = vminps_avx(auVar34,auVar40);
              auVar96 = vcmpps_avx(auVar96,auVar34,2);
              goto LAB_00301d0b;
            }
            bVar18 = false;
          }
          if (bVar18) {
            if (unaff_R15 == 0) {
              iVar23 = 4;
            }
            else {
              uVar21 = uVar22 & 0xfffffffffffffff0;
              lVar25 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              iVar23 = 0;
              uVar22 = *(ulong *)(uVar21 + lVar25 * 8);
              uVar24 = unaff_R15 - 1 & unaff_R15;
              if (uVar24 != 0) {
                pNVar26->ptr = uVar22;
                lVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                uVar20 = uVar24 - 1;
                while( true ) {
                  pNVar26 = pNVar26 + 1;
                  uVar22 = *(ulong *)(uVar21 + lVar25 * 8);
                  uVar20 = uVar20 & uVar24;
                  if (uVar20 == 0) break;
                  pNVar26->ptr = uVar22;
                  lVar25 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                  uVar24 = uVar20 - 1;
                }
              }
            }
          }
          else {
            iVar23 = 6;
          }
        } while (iVar23 == 0);
        if (iVar23 == 6) {
          auVar86 = ZEXT1664(auVar86._0_16_);
          auVar97 = ZEXT1664(auVar97._0_16_);
          cVar19 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar22 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          iVar23 = 0;
          if (cVar19 != '\0') {
            ray->tfar = -INFINITY;
            iVar23 = 3;
          }
        }
      } while (iVar23 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }